

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O3

void __thiscall WriteIncludesBase::acceptProperty(WriteIncludesBase *this,DomProperty *node)

{
  Kind KVar1;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  KVar1 = node->m_kind;
  if (KVar1 == Date) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = L"QDate";
    local_38.d.size = 5;
    add(this,&local_38,(DomCustomWidget *)0x0);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    KVar1 = node->m_kind;
  }
  if (KVar1 == Locale) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = L"QLocale";
    local_38.d.size = 7;
    add(this,&local_38,(DomCustomWidget *)0x0);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    KVar1 = node->m_kind;
  }
  if (KVar1 == IconSet) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = L"QIcon";
    local_38.d.size = 5;
    add(this,&local_38,(DomCustomWidget *)0x0);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  TreeWalker::acceptProperty(&this->super_TreeWalker,node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptProperty(DomProperty *node)
{
    if (node->kind() == DomProperty::Date)
        add(QStringLiteral("QDate"));
    if (node->kind() == DomProperty::Locale)
        add(QStringLiteral("QLocale"));
    if (node->kind() == DomProperty::IconSet)
        add(QStringLiteral("QIcon"));
    TreeWalker::acceptProperty(node);
}